

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i32_Wrap_i64_(w3Interp *this)

{
  int64_t *piVar1;
  w3Interp *this_local;
  
  piVar1 = w3Stack::i64(&this->super_w3Stack);
  w3Stack::set_i32(&this->super_w3Stack,(int32_t)*piVar1);
  return;
}

Assistant:

INTERP (i32_Wrap_i64_)
{
    set_i32 ((int32_t)(i64 () & 0xFFFFFFFF));
}